

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

MatchTool * generate_Dtran(MatchTool *__return_storage_ptr__,RegexTree *tree)

{
  ulong uVar1;
  char cVar2;
  int *piVar3;
  pointer piVar4;
  bool bVar5;
  int iVar6;
  __node_base _Var7;
  mapped_type *__args;
  ulong uVar8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  ulong uVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  long lVar12;
  pointer pDVar13;
  pointer pDVar14;
  int *piVar15;
  int *piVar16;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> __it;
  int **ppiVar17;
  long lVar18;
  __node_base _Var19;
  pointer piVar20;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> _Var21;
  __normal_iterator<Dstate_*,_std::vector<Dstate,_std::allocator<Dstate>_>_> __it_00;
  vector<int,_std::allocator<int>_> tmp;
  vector<Dstate,_std::allocator<Dstate>_> Dstates;
  int j;
  vector<int,_std::allocator<int>_> targets;
  vector<int,_std::allocator<int>_> firstpos;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  Dtran;
  vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> table;
  StateMap mp;
  FollowPos fp;
  StateSet first_set;
  tree_node *p;
  int *local_2b8;
  iterator iStack_2b0;
  int *local_2a8;
  Dstate *local_2a0;
  int local_294;
  vector<Dstate,_std::allocator<Dstate>_> local_290;
  int **local_278;
  int **ppiStack_270;
  int **local_268;
  vector<int,_std::allocator<int>_> local_258;
  ulong local_240;
  vector<int,_std::allocator<int>_> local_238;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_218;
  MatchTool *local_200;
  vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> local_1f8;
  int *local_1e0;
  long local_1d8;
  Dstate *local_1d0;
  int *local_1c8;
  _Hashtable<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1c0;
  FollowPos local_188;
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_170;
  value_type local_138 [8];
  
  local_138[0]._0_8_ = (_Hash_node_base *)0xffffffff;
  local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_200 = __return_storage_ptr__;
  std::vector<Dstate,_std::allocator<Dstate>_>::vector
            (&local_290,1,local_138,(allocator_type *)&local_1c0);
  if (local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_218.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1c0._M_buckets = &local_1c0._M_single_bucket;
  local_1c0._M_bucket_count = 1;
  local_1c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c0._M_element_count = 0;
  local_1c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c0._M_rehash_policy._M_next_resize = 0;
  local_1c0._M_single_bucket = (__node_base_ptr)0x0;
  RegexTree::number_node
            ((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
              *)&local_1c0,tree->root,1);
  std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::vector
            (&local_1f8,local_1c0._M_element_count + 1,(allocator_type *)local_138);
  for (_Var7._M_nxt = local_1c0._M_before_begin._M_nxt; _Var7._M_nxt != (_Hash_node_base *)0x0;
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
    local_1f8.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
    super__Vector_impl_data._M_start[*(int *)&_Var7._M_nxt[2]._M_nxt] =
         (tree_node *)_Var7._M_nxt[1]._M_nxt;
  }
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  RegexTree::get_followpos(&local_188,tree,(StateMap *)&local_1c0);
  RegexTree::firstpos((StateSet *)&local_170,tree);
  if (local_170._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var19._M_nxt = local_170._M_before_begin._M_nxt;
    do {
      local_138[0]._0_8_ = _Var19._M_nxt[1]._M_nxt;
      __args = std::__detail::
               _Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&local_1c0,(key_type *)local_138);
      if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_238,
                   (iterator)
                   local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *__args;
        local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      _Var19._M_nxt = (_Var19._M_nxt)->_M_nxt;
    } while (_Var19._M_nxt != (_Hash_node_base *)0x0);
  }
  piVar4 = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar20 = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar12 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar20,piVar4);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&(local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
               super__Vector_impl_data._M_start)->states,&local_238);
  local_138[0]._0_8_ = local_1c0._M_element_count;
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    (((local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_start)->states).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start);
  if (_Var9._M_current !=
      ((local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
        super__Vector_impl_data._M_start)->states).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_138[0].mark = 1;
    if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_258,
                 (iterator)
                 local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_138[0].mark);
    }
    else {
      *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 1;
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar10 = (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    local_294 = 0;
    uVar8 = 0;
    do {
      pDVar13 = local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = 0;
      pDVar14 = local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (pDVar14->mark == -1) {
          local_294 = (int)lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
        pDVar14 = pDVar14 + 1;
      } while (uVar10 + (uVar10 == 0) != lVar12);
      uVar1 = uVar8 + 1;
      lVar12 = (long)local_294;
      local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar12].mark = (int)uVar1;
      local_240 = uVar8;
      memset(local_138,0,0x100);
      local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT17(1,local_138[0].states.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_7_);
      piVar15 = pDVar13[lVar12].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar16 = pDVar13[lVar12].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_1d8 = lVar12 * 0x20;
      if (piVar15 != piVar16) {
        local_240 = local_240 + 2;
        local_1e0 = piVar16;
        do {
          cVar2 = local_1f8.
                  super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar15]->c;
          lVar12 = (long)cVar2;
          if (*(char *)((long)&local_138[0].mark + lVar12) == '\0') {
            *(undefined1 *)((long)&local_138[0].mark + lVar12) = 1;
            local_2b8 = (int *)0x0;
            iStack_2b0._M_current = (int *)0x0;
            local_2a8 = (int *)0x0;
            piVar3 = *(int **)((long)&((local_290.
                                        super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                                        super__Vector_impl_data._M_start)->states).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish + local_1d8);
            local_1c8 = piVar15;
            for (piVar16 = *(int **)((long)&((local_290.
                                              super__Vector_base<Dstate,_std::allocator<Dstate>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->states).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + local_1d8);
                piVar15 = local_2b8, piVar16 != piVar3; piVar16 = piVar16 + 1) {
              iVar6 = *piVar16;
              if (local_1f8.
                  super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar6]->c == cVar2) {
                piVar4 = local_188.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar6].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (piVar20 = local_188.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar6].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start; piVar20 != piVar4;
                    piVar20 = piVar20 + 1) {
                  local_278 = (int **)CONCAT44(local_278._4_4_,*piVar20);
                  _Var11 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                     (local_2b8,iStack_2b0._M_current,
                                      (_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)
                                      &local_278);
                  if (_Var11._M_current == iStack_2b0._M_current) {
                    if (iStack_2b0._M_current == local_2a8) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_2b8,iStack_2b0,
                                 (int *)&local_278);
                    }
                    else {
                      *iStack_2b0._M_current = (int)local_278;
                      iStack_2b0._M_current = iStack_2b0._M_current + 1;
                    }
                  }
                }
              }
            }
            if (local_2b8 != iStack_2b0._M_current) {
              uVar8 = (long)iStack_2b0._M_current - (long)local_2b8 >> 2;
              lVar18 = 0x3f;
              if (uVar8 != 0) {
                for (; uVar8 >> lVar18 == 0; lVar18 = lVar18 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_2b8,iStack_2b0._M_current,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (piVar15);
            }
            local_278 = &local_2b8;
            lVar18 = (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                           super__Vector_impl_data._M_start >> 7;
            local_1d0 = local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                        super__Vector_impl_data._M_start;
            pDVar13 = local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            __it._M_current =
                 local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                 super__Vector_impl_data._M_start;
            if (0 < lVar18) {
              local_2a0 = local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              __it._M_current =
                   (Dstate *)
                   ((long)&(local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                            super__Vector_impl_data._M_start)->mark +
                   ((long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff80U));
              lVar18 = lVar18 + 1;
              __it_00._M_current =
                   local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_start;
              do {
                bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                        operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278,
                                   __it_00);
                pDVar13 = local_2a0;
                _Var21._M_current = __it_00._M_current;
                if (bVar5) goto LAB_001044cd;
                bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                        operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278,
                                   __it_00._M_current + 1);
                pDVar13 = local_2a0;
                _Var21._M_current = __it_00._M_current + 1;
                if (bVar5) goto LAB_001044cd;
                bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                        operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278,
                                   __it_00._M_current + 2);
                pDVar13 = local_2a0;
                _Var21._M_current = __it_00._M_current + 2;
                if (bVar5) goto LAB_001044cd;
                bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                        operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278,
                                   __it_00._M_current + 3);
                pDVar13 = local_2a0;
                _Var21._M_current = __it_00._M_current + 3;
                if (bVar5) goto LAB_001044cd;
                __it_00._M_current = __it_00._M_current + 4;
                lVar18 = lVar18 + -1;
              } while (1 < lVar18);
            }
            lVar18 = (long)pDVar13 - (long)__it._M_current >> 5;
            if (lVar18 == 1) {
LAB_001044b6:
              bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                      operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278,
                                 __it);
              _Var21._M_current = __it._M_current;
              if (!bVar5) {
                _Var21._M_current = pDVar13;
              }
            }
            else if (lVar18 == 2) {
LAB_00104491:
              bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                      operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278,
                                 __it);
              _Var21._M_current = __it._M_current;
              if (!bVar5) {
                __it._M_current = __it._M_current + 1;
                goto LAB_001044b6;
              }
            }
            else {
              _Var21._M_current = pDVar13;
              if ((lVar18 == 3) &&
                 (bVar5 = __gnu_cxx::__ops::_Iter_pred<generate_Dtran(RegexTree_const&)::$_0>::
                          operator()((_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278
                                     ,__it), _Var21._M_current = __it._M_current, !bVar5)) {
                __it._M_current = __it._M_current + 1;
                goto LAB_00104491;
              }
            }
LAB_001044cd:
            if (_Var21._M_current == pDVar13) {
              std::vector<Dstate,_std::allocator<Dstate>_>::emplace_back<>(&local_290);
              local_278 = (int **)local_1c0._M_element_count;
              _Var9 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                (local_2b8,iStack_2b0._M_current,
                                 (_Iter_pred<generate_Dtran(RegexTree_const&)::__0> *)&local_278);
              if (_Var9._M_current != iStack_2b0._M_current) {
                iVar6 = (int)((ulong)((long)local_290.
                                            super__Vector_base<Dstate,_std::allocator<Dstate>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_290.
                                           super__Vector_base<Dstate,_std::allocator<Dstate>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 5);
                local_278 = (int **)CONCAT44(local_278._4_4_,iVar6);
                if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (&local_258,
                             (iterator)
                             local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_278);
                }
                else {
                  *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar6;
                  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].states);
            }
            if ((ulong)(((long)local_218.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_218.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ) < local_240) {
              local_278 = (int **)0x0;
              ppiStack_270 = (int **)0x0;
              local_268 = (int **)0x0;
              local_278 = (int **)operator_new(0x400);
              ppiVar17 = local_278 + 0x80;
              ppiStack_270 = local_278;
              local_268 = ppiVar17;
              memset(local_278,0,0x400);
              ppiStack_270 = ppiVar17;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::resize(&local_218,local_240,(value_type *)&local_278);
              if (local_278 != (int **)0x0) {
                operator_delete(local_278,(long)local_268 - (long)local_278);
              }
            }
            local_218.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar1].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar12] = (int)((ulong)((long)_Var21._M_current - (long)local_1d0) >> 5) + 1;
            piVar15 = local_1c8;
            piVar16 = local_1e0;
            if (local_2b8 != (int *)0x0) {
              operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
              piVar15 = local_1c8;
              piVar16 = local_1e0;
            }
          }
          piVar15 = piVar15 + 1;
        } while (piVar15 != piVar16);
      }
      uVar10 = (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_290.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
      uVar8 = uVar1;
    } while (uVar1 < uVar10);
  }
  MatchTool::MatchTool(local_200,&local_218,&local_258);
  std::
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_170);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_188);
  if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1c0);
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_218);
  std::vector<Dstate,_std::allocator<Dstate>_>::~vector(&local_290);
  return local_200;
}

Assistant:

MatchTool generate_Dtran(const RegexTree& tree) {
    std::vector<Dstate> Dstates(1, Dstate());
    std::vector<std::vector<int>> Dtran;
    std::vector<int> targets;
    RegexTree::StateMap mp;
    tree.number_node(mp);
    std::vector<const tree_node *> table(mp.size() + 1);
    for (const auto &p : mp)
        table[p.second] = p.first;
    std::vector<int> firstpos;
    RegexTree::FollowPos fp = tree.get_followpos(mp);
    int is_marked = 0;
    int curr = 0;

    RegexTree::StateSet first_set = tree.firstpos();
    for (const tree_node *p : first_set) firstpos.push_back(mp.at(p));
    std::sort(firstpos.begin(), firstpos.end());
    Dstates.front().states = firstpos;
    if (std::find(Dstates.front().states.cbegin(),
            Dstates.front().states.cend(), mp.size()) != Dstates.front().states.cend())
        targets.push_back(1);

    while (is_marked < Dstates.size()) {
        for (int i = 0; i < Dstates.size(); i++)
            if (Dstates[i].mark == -1) {
                curr = i;
                break;
            }
        ++is_marked;
        Dstates[curr].mark = is_marked; // mark this state

        bool alphabet[256];
        for (bool &i : alphabet)
            i = false;
        alphabet[ACCEPT] = true;

        for (int state : Dstates[curr].states) {
            char ch = table[state]->c;
            if (alphabet[ch])
                continue;
            else
                alphabet[ch] = true;

            std::vector<int> tmp;
            for (int state2 : Dstates[curr].states) {
                if (table[state2]->c == ch)
                    for (int j : fp[state2]) {
                        if (std::find(tmp.begin(), tmp.end(), j) == tmp.end())
                            tmp.push_back(j);
                    }
            }
            std::sort(tmp.begin(), tmp.end());

            auto iter = std::find_if(Dstates.begin(), Dstates.end(), [&tmp](Dstate &s) {
                return s.states == tmp;
            });
            int state_num = static_cast<int>(iter - Dstates.begin()) + 1;
            if (iter == Dstates.end()) {
                Dstates.emplace_back();
                if (std::find(tmp.cbegin(), tmp.cend(), mp.size()) != tmp.cend())
                    targets.push_back(static_cast<int>(Dstates.size()));
                Dstates.back().states = std::move(tmp);
            }
            if (Dtran.size() < is_marked + 1)
                Dtran.resize(static_cast<unsigned long>(is_marked + 1) // NOLINT
                        , std::vector<int>(256, 0));
            Dtran[is_marked][ch] = state_num;
        }
    }
    return MatchTool(std::move(Dtran), std::move(targets));
}